

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

int VectorMismatch_SSE2(uint32_t *array1,uint32_t *array2,int length)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  int in_ECX;
  int iVar5;
  int iVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  
  if (length < 0xc) {
    uVar4 = 0;
    if (((3 < length) &&
        (auVar14._0_4_ = -(uint)(*array2 == *array1),
        auVar14._4_4_ = -(uint)(array2[1] == array1[1]),
        auVar14._8_4_ = -(uint)(array2[2] == array1[2]),
        auVar14._12_4_ = -(uint)(array2[3] == array1[3]), iVar5 = movmskps(in_ECX,auVar14),
        iVar5 == 0xf)) && (uVar4 = 4, 7 < length)) {
      auVar15._0_4_ = -(uint)(array2[4] == array1[4]);
      auVar15._4_4_ = -(uint)(array2[5] == array1[5]);
      auVar15._8_4_ = -(uint)(array2[6] == array1[6]);
      auVar15._12_4_ = -(uint)(array2[7] == array1[7]);
      iVar5 = movmskps(4,auVar15);
      uVar4 = (ulong)((uint)(iVar5 == 0xf) * 4 + 4);
    }
  }
  else {
    uVar8 = *array1;
    uVar9 = array1[1];
    uVar10 = array1[2];
    uVar11 = array1[3];
    uVar12 = *array2;
    uVar16 = array2[1];
    uVar17 = array2[2];
    uVar18 = array2[3];
    uVar4 = 0;
    do {
      auVar19._0_4_ = -(uint)(uVar8 == uVar12);
      auVar19._4_4_ = -(uint)(uVar9 == uVar16);
      auVar19._8_4_ = -(uint)(uVar10 == uVar17);
      auVar19._12_4_ = -(uint)(uVar11 == uVar18);
      iVar5 = movmskps(in_ECX,auVar19);
      if (iVar5 == 0xf) {
        iVar5 = (int)uVar4;
        puVar1 = array1 + (long)iVar5 + 4;
        puVar2 = array2 + (long)iVar5 + 4;
        auVar13._0_4_ = -(uint)(*puVar2 == *puVar1);
        auVar13._4_4_ = -(uint)(puVar2[1] == puVar1[1]);
        auVar13._8_4_ = -(uint)(puVar2[2] == puVar1[2]);
        auVar13._12_4_ = -(uint)(puVar2[3] == puVar1[3]);
        iVar6 = movmskps(0xf,auVar13);
        bVar7 = iVar6 == 0xf;
        if (bVar7) {
          uVar3 = iVar5 + 8;
        }
        else {
          uVar3 = iVar5 + 4;
        }
        uVar4 = (ulong)uVar3;
        puVar1 = array1 + (long)iVar5 + 8;
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        uVar10 = puVar1[2];
        uVar11 = puVar1[3];
        puVar1 = array2 + (long)iVar5 + 8;
        uVar12 = *puVar1;
        uVar16 = puVar1[1];
        uVar17 = puVar1[2];
        uVar18 = puVar1[3];
      }
      else {
        bVar7 = false;
      }
    } while ((bVar7) && (in_ECX = (int)uVar4 + 0xc, in_ECX < length));
  }
  if ((int)uVar4 < length) {
    uVar4 = (ulong)(int)uVar4;
    do {
      if (array1[uVar4] != array2[uVar4]) goto LAB_00172e4a;
      uVar4 = uVar4 + 1;
    } while (length != (int)uVar4);
    uVar4 = (ulong)(uint)length;
  }
LAB_00172e4a:
  return (int)uVar4;
}

Assistant:

static int VectorMismatch_SSE2(const uint32_t* const array1,
                               const uint32_t* const array2, int length) {
  int match_len;

  if (length >= 12) {
    __m128i A0 = _mm_loadu_si128((const __m128i*)&array1[0]);
    __m128i A1 = _mm_loadu_si128((const __m128i*)&array2[0]);
    match_len = 0;
    do {
      // Loop unrolling and early load both provide a speedup of 10% for the
      // current function. Also, max_limit can be MAX_LENGTH=4096 at most.
      const __m128i cmpA = _mm_cmpeq_epi32(A0, A1);
      const __m128i B0 =
          _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
      const __m128i B1 =
          _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
      if (_mm_movemask_epi8(cmpA) != 0xffff) break;
      match_len += 4;

      {
        const __m128i cmpB = _mm_cmpeq_epi32(B0, B1);
        A0 = _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
        A1 = _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
        if (_mm_movemask_epi8(cmpB) != 0xffff) break;
        match_len += 4;
      }
    } while (match_len + 12 < length);
  } else {
    match_len = 0;
    // Unroll the potential first two loops.
    if (length >= 4 &&
        _mm_movemask_epi8(_mm_cmpeq_epi32(
            _mm_loadu_si128((const __m128i*)&array1[0]),
            _mm_loadu_si128((const __m128i*)&array2[0]))) == 0xffff) {
      match_len = 4;
      if (length >= 8 &&
          _mm_movemask_epi8(_mm_cmpeq_epi32(
              _mm_loadu_si128((const __m128i*)&array1[4]),
              _mm_loadu_si128((const __m128i*)&array2[4]))) == 0xffff) {
        match_len = 8;
      }
    }
  }

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}